

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void * lua_upvalueid(lua_State *L,int fidx,int n)

{
  lua_CFunction p_Var1;
  TValue *pTVar2;
  UpVal **ppUVar3;
  ushort uVar4;
  char *__assertion;
  
  pTVar2 = index2addr(L,fidx);
  uVar4 = pTVar2->tt_ & 0x7f;
  if (uVar4 != 0x26) {
    if (uVar4 == 6) {
      ppUVar3 = getupvalref(L,fidx,n,(LClosure **)0x0,(ravi_type_map *)0x0);
      return *ppUVar3;
    }
    __assert_fail("(0) && \"closure expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x68b,"void *lua_upvalueid(lua_State *, int, int)");
  }
  if (pTVar2->tt_ == 0x8026) {
    p_Var1 = (pTVar2->value_).f;
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x26) {
      if ((0 < n) && ((uint)n <= (uint)(byte)p_Var1[10])) {
        return p_Var1 + (ulong)(n - 1) * 0x10 + 0x20;
      }
      __assert_fail("(1 <= n && n <= f->nupvalues) && \"invalid upvalue index\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x687,"void *lua_upvalueid(lua_State *, int, int)");
    }
    __assertion = "(((fi)->value_).gc)->tt == ((6) | ((2) << 4))";
  }
  else {
    __assertion = "((((fi))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x686,"void *lua_upvalueid(lua_State *, int, int)");
}

Assistant:

LUA_API void *lua_upvalueid (lua_State *L, int fidx, int n) {
  StkId fi = index2addr(L, fidx);
  switch (ttype(fi)) {
    case LUA_TLCL: {  /* lua closure */
      return *getupvalref(L, fidx, n, NULL, NULL);
    }
    case LUA_TCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      api_check(L, 1 <= n && n <= f->nupvalues, "invalid upvalue index");
      return &f->upvalue[n - 1];
    }
    default: {
      api_check(L, 0, "closure expected");
      return NULL;
    }
  }
}